

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void kj::resetCrashHandlers(void)

{
  int iVar1;
  Fault f;
  sigaction local_a8;
  
  memset(&local_a8,0,0x98);
  do {
    iVar1 = sigaction(0xb,&local_a8,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_001b8362;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
               ,0x372,iVar1,"sigaction(SIGSEGV, &action, nullptr)","");
    _::Debug::Fault::fatal(&f);
  }
LAB_001b8362:
  do {
    iVar1 = sigaction(7,&local_a8,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_001b8389;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
               ,0x373,iVar1,"sigaction(SIGBUS, &action, nullptr)","");
    _::Debug::Fault::fatal(&f);
  }
LAB_001b8389:
  do {
    iVar1 = sigaction(8,&local_a8,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_001b83b0;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
               ,0x374,iVar1,"sigaction(SIGFPE, &action, nullptr)","");
    _::Debug::Fault::fatal(&f);
  }
LAB_001b83b0:
  do {
    iVar1 = sigaction(6,&local_a8,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_001b83d7;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
               ,0x375,iVar1,"sigaction(SIGABRT, &action, nullptr)","");
    _::Debug::Fault::fatal(&f);
  }
LAB_001b83d7:
  do {
    iVar1 = sigaction(4,&local_a8,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_001b83fe;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
               ,0x376,iVar1,"sigaction(SIGILL, &action, nullptr)","");
    _::Debug::Fault::fatal(&f);
  }
LAB_001b83fe:
  do {
    iVar1 = sigaction(0x1f,&local_a8,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_001b8425;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
               ,0x377,iVar1,"sigaction(SIGSYS, &action, nullptr)","");
    _::Debug::Fault::fatal(&f);
  }
LAB_001b8425:
  std::set_terminate((_func_void *)0x0);
  return;
}

Assistant:

void resetCrashHandlers() {
#ifndef _WIN32
  struct sigaction action;
  memset(&action, 0, sizeof(action));

  action.sa_handler = SIG_DFL;
  KJ_SYSCALL(sigaction(SIGSEGV, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGBUS, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGFPE, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGABRT, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGILL, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGSYS, &action, nullptr));

#ifdef KJ_DEBUG
  KJ_SYSCALL(sigaction(SIGINT, &action, nullptr));
#endif
#endif

  std::set_terminate(nullptr);
}